

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O1

void __thiscall
duckdb::TextTreeRenderer::RenderBottomLayer
          (TextTreeRenderer *this,RenderTree *root,ostream *ss,idx_t y)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  optional_ptr<duckdb::RenderTreeNode,_true> oVar4;
  size_t sVar5;
  ulong x;
  ulong x_00;
  char *pcVar6;
  allocator local_81;
  string local_80;
  string local_60;
  ostream *local_40;
  idx_t local_38;
  
  local_38 = y + 1;
  x = 0;
  local_40 = ss;
  do {
    if ((this->config).maximum_render_width <= (this->config).node_render_width * x) break;
    if (x < root->width) {
      x_00 = x;
      bVar3 = false;
      do {
        bVar2 = true;
        if (bVar3 == false) {
          bVar2 = RenderTree::HasNode(root,x_00,y);
        }
        x_00 = x_00 + 1;
        bVar3 = bVar2;
      } while (x_00 < root->width);
    }
    else {
      bVar2 = false;
    }
    oVar4 = RenderTree::GetNode(root,x,y);
    ss = local_40;
    if (oVar4.ptr == (RenderTreeNode *)0x0) {
      bVar3 = RenderTree::HasNode(root,x,local_38);
      ss = local_40;
      if (bVar3) {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60," ","");
        StringUtil::Repeat(&local_80,&local_60,(this->config).node_render_width >> 1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_40,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                             local_80._M_dataplus._M_p._0_1_),
                   local_80._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) !=
            &local_80.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_))
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        ss = local_40;
        pcVar6 = (this->config).VERTICAL;
        if (pcVar6 == (char *)0x0) {
          ::std::ios::clear((int)*(undefined8 *)(*(long *)local_40 + -0x18) + (int)local_40);
        }
        else {
          sVar5 = strlen(pcVar6);
          ss = local_40;
          ::std::__ostream_insert<char,std::char_traits<char>>(local_40,pcVar6,sVar5);
        }
        if ((bVar2 != false) || (bVar2 = ShouldRenderWhitespace(root,x,y), bVar2)) {
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60," ","");
          StringUtil::Repeat(&local_80,&local_60,(this->config).node_render_width >> 1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (ss,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                         local_80._M_dataplus._M_p._0_1_),local_80._M_string_length)
          ;
LAB_015c64c3:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) !=
              &local_80.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_
                                    ));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p);
          }
        }
      }
      else if ((bVar2 != false) || (bVar2 = ShouldRenderWhitespace(root,x,y), bVar2)) {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60," ","");
        StringUtil::Repeat(&local_80,&local_60,(this->config).node_render_width);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (ss,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                       local_80._M_dataplus._M_p._0_1_),local_80._M_string_length);
        goto LAB_015c64c3;
      }
    }
    else {
      pcVar6 = (this->config).LDCORNER;
      iVar1 = (int)local_40;
      if (pcVar6 == (char *)0x0) {
        ::std::ios::clear((int)*(undefined8 *)(*(long *)local_40 + -0x18) + iVar1);
      }
      else {
        sVar5 = strlen(pcVar6);
        ::std::__ostream_insert<char,std::char_traits<char>>(ss,pcVar6,sVar5);
      }
      ::std::__cxx11::string::string((string *)&local_60,(this->config).HORIZONTAL,&local_81);
      StringUtil::Repeat(&local_80,&local_60,((this->config).node_render_width >> 1) - 1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (ss,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_
                                    ),local_80._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) !=
          &local_80.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      bVar2 = RenderTree::HasNode(root,x,local_38);
      if (bVar2) {
        pcVar6 = (this->config).TMIDDLE;
      }
      else {
        pcVar6 = (this->config).HORIZONTAL;
      }
      if (pcVar6 == (char *)0x0) {
        ::std::ios::clear((int)*(undefined8 *)(*(long *)ss + -0x18) + iVar1);
      }
      else {
        sVar5 = strlen(pcVar6);
        ::std::__ostream_insert<char,std::char_traits<char>>(ss,pcVar6,sVar5);
      }
      ::std::__cxx11::string::string((string *)&local_60,(this->config).HORIZONTAL,&local_81);
      StringUtil::Repeat(&local_80,&local_60,((this->config).node_render_width >> 1) - 1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (ss,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_
                                    ),local_80._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) !=
          &local_80.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      pcVar6 = (this->config).RDCORNER;
      if (pcVar6 == (char *)0x0) {
        ::std::ios::clear((int)*(undefined8 *)(*(long *)ss + -0x18) + iVar1);
      }
      else {
        sVar5 = strlen(pcVar6);
        ::std::__ostream_insert<char,std::char_traits<char>>(ss,pcVar6,sVar5);
      }
    }
    x = x + 1;
  } while (x <= root->width);
  local_80._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>(ss,(char *)&local_80,1);
  return;
}

Assistant:

void TextTreeRenderer::RenderBottomLayer(RenderTree &root, std::ostream &ss, idx_t y) {
	for (idx_t x = 0; x <= root.width; x++) {
		if (x * config.node_render_width >= config.maximum_render_width) {
			break;
		}
		bool has_adjacent_nodes = false;
		for (idx_t i = 0; x + i < root.width; i++) {
			has_adjacent_nodes = has_adjacent_nodes || root.HasNode(x + i, y);
		}
		auto node = root.GetNode(x, y);
		if (node) {
			ss << config.LDCORNER;
			ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2 - 1);
			if (root.HasNode(x, y + 1)) {
				// node below this one: connect to that one
				ss << config.TMIDDLE;
			} else {
				// no node below this one: end the box
				ss << config.HORIZONTAL;
			}
			ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2 - 1);
			ss << config.RDCORNER;
		} else if (root.HasNode(x, y + 1)) {
			ss << StringUtil::Repeat(" ", config.node_render_width / 2);
			ss << config.VERTICAL;
			if (has_adjacent_nodes || ShouldRenderWhitespace(root, x, y)) {
				ss << StringUtil::Repeat(" ", config.node_render_width / 2);
			}
		} else {
			if (has_adjacent_nodes || ShouldRenderWhitespace(root, x, y)) {
				ss << StringUtil::Repeat(" ", config.node_render_width);
			}
		}
	}
	ss << '\n';
}